

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_status_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::SubscriptonStatusTest_test_to_string_Test::
SubscriptonStatusTest_test_to_string_Test(SubscriptonStatusTest_test_to_string_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00277df8;
  return;
}

Assistant:

TEST(SubscriptonStatusTest, test_to_string)
{
    EXPECT_EQ("UNAVAILABLE", subscription_status_map[SubscriptionStatus::UNAVAILABLE]);
    EXPECT_EQ("CLOSED", subscription_status_map[SubscriptionStatus::CLOSED]);
    EXPECT_EQ("CANCELLED", subscription_status_map[SubscriptionStatus::CANCELLED]);
    EXPECT_EQ("DISCONTINUED", subscription_status_map[SubscriptionStatus::DISCONTINUED]);
    EXPECT_EQ("EXHAUSTED", subscription_status_map[SubscriptionStatus::EXHAUSTED]);
    EXPECT_EQ("INACTIVE", subscription_status_map[SubscriptionStatus::INACTIVE]);
    EXPECT_EQ("OK", subscription_status_map[SubscriptionStatus::OK]);
    EXPECT_EQ("PENDING", subscription_status_map[SubscriptionStatus::PENDING]);
    EXPECT_EQ("PROHIBITED", subscription_status_map[SubscriptionStatus::PROHIBITED]);
    EXPECT_EQ("REJECTED", subscription_status_map[SubscriptionStatus::REJECTED]);
    EXPECT_EQ("STALE", subscription_status_map[SubscriptionStatus::STALE]);
    EXPECT_EQ("TIMEOUT", subscription_status_map[SubscriptionStatus::TIMEOUT]);
}